

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

void __thiscall
anurbs::NurbsCurveGeometry<2L>::set_poles
          (NurbsCurveGeometry<2L> *this,
          Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_> *poles)

{
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,2,1,_1,2>,Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>const,0,Eigen::OuterStride<_1>>>
            (&this->m_poles,poles);
  return;
}

Assistant:

void set_poles(Eigen::Ref<const Poles> poles)
    {
        if (poles.rows() != nb_poles() && poles.cols() != dimension()) {
            throw std::runtime_error("Invalid size");
        }

        m_poles = poles;
    }